

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

InitializeConnectionRequest * __thiscall
perfetto::protos::gen::InitializeConnectionRequest::operator=
          (InitializeConnectionRequest *this,InitializeConnectionRequest *param_1)

{
  uint32_t uVar1;
  InitializeConnectionRequest *param_1_local;
  InitializeConnectionRequest *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  uVar1 = param_1->shared_memory_size_hint_bytes_;
  this->shared_memory_page_size_hint_bytes_ = param_1->shared_memory_page_size_hint_bytes_;
  this->shared_memory_size_hint_bytes_ = uVar1;
  ::std::__cxx11::string::operator=
            ((string *)&this->producer_name_,(string *)&param_1->producer_name_);
  this->smb_scraping_mode_ = param_1->smb_scraping_mode_;
  this->producer_provided_shmem_ = param_1->producer_provided_shmem_;
  ::std::__cxx11::string::operator=((string *)&this->sdk_version_,(string *)&param_1->sdk_version_);
  ::std::__cxx11::string::operator=
            ((string *)&this->shm_key_windows_,(string *)&param_1->shm_key_windows_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool InitializeConnectionRequest::operator==(const InitializeConnectionRequest& other) const {
  return unknown_fields_ == other.unknown_fields_
   && shared_memory_page_size_hint_bytes_ == other.shared_memory_page_size_hint_bytes_
   && shared_memory_size_hint_bytes_ == other.shared_memory_size_hint_bytes_
   && producer_name_ == other.producer_name_
   && smb_scraping_mode_ == other.smb_scraping_mode_
   && producer_provided_shmem_ == other.producer_provided_shmem_
   && sdk_version_ == other.sdk_version_
   && shm_key_windows_ == other.shm_key_windows_;
}